

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  int *ip;
  BYTE *pInLimit;
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  uint uVar5;
  uint uVar6;
  U32 UVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  uint uVar21;
  int *ip_00;
  bool bVar22;
  uint local_ac;
  int *local_90;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  pBVar19 = (ms->window).base + (ms->window).dictLimit;
  uVar1 = *rep;
  uVar2 = rep[1];
  ip_00 = (int *)((ulong)(pBVar19 == (BYTE *)src) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar5 = (int)ip_00 - (int)pBVar19;
  local_ac = uVar2;
  if (uVar5 < uVar2) {
    local_ac = 0;
  }
  uVar10 = (ulong)uVar1;
  if (uVar5 < uVar1) {
    uVar10 = 0;
  }
  piVar9 = (int *)((long)src + (srcSize - 8));
  do {
    uVar16 = (uint)uVar10;
    lVar14 = -uVar10;
    while( true ) {
      if (piVar9 <= ip_00) {
        uVar8 = 0;
        if (uVar5 < uVar2) {
          uVar8 = uVar2;
        }
        if (uVar5 < uVar1) {
          uVar8 = uVar1;
        }
        if (uVar16 == 0) {
          uVar16 = uVar8;
        }
        if (local_ac != 0) {
          uVar8 = local_ac;
        }
        *rep = uVar16;
        rep[1] = uVar8;
        return (long)pInLimit - (long)src;
      }
      if (uVar16 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        if (*(int *)((long)ip_00 + 1) == *(int *)((long)ip_00 + lVar14 + 1)) {
          sVar11 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar14 + 5),pInLimit)
          ;
          uVar10 = sVar11 + 4;
        }
      }
      iVar17 = (int)ip_00;
      if (cParams->searchLength - 6 < 2) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar8 = (ms->window).lowLimit;
        uVar21 = iVar17 - (int)pBVar4;
        uVar13 = uVar21 - uVar6;
        if (uVar21 < uVar6) {
          uVar13 = 0;
        }
        iVar17 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
        uVar15 = 99999999;
        uVar12 = 3;
        while( true ) {
          bVar22 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar7 <= uVar8) || (bVar22)) ||
              ((pBVar20 = pBVar4 + UVar7, pBVar20[uVar12] == *(BYTE *)((long)ip_00 + uVar12) &&
               ((sVar11 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar12 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar7), uVar12 = sVar11,
                (BYTE *)(sVar11 + (long)ip_00) == pInLimit)))))) || (UVar7 <= uVar13)) break;
          UVar7 = pUVar3[UVar7 & uVar6 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar8 = (ms->window).lowLimit;
        uVar21 = iVar17 - (int)pBVar4;
        uVar13 = uVar21 - uVar6;
        if (uVar21 < uVar6) {
          uVar13 = 0;
        }
        iVar17 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
        uVar15 = 99999999;
        uVar12 = 3;
        while( true ) {
          bVar22 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if (((UVar7 <= uVar8) || (bVar22)) ||
             (((pBVar20 = pBVar4 + UVar7, pBVar20[uVar12] == *(BYTE *)((long)ip_00 + uVar12) &&
               ((sVar11 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar12 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar7), uVar12 = sVar11,
                (BYTE *)(sVar11 + (long)ip_00) == pInLimit)))) || (UVar7 <= uVar13)))) break;
          UVar7 = pUVar3[UVar7 & uVar6 - 1];
        }
      }
      else {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar8 = (ms->window).lowLimit;
        uVar21 = iVar17 - (int)pBVar4;
        uVar13 = uVar21 - uVar6;
        if (uVar21 < uVar6) {
          uVar13 = 0;
        }
        iVar17 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
        uVar15 = 99999999;
        uVar12 = 3;
        while( true ) {
          bVar22 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar7 <= uVar8) || (bVar22)) ||
              ((pBVar20 = pBVar4 + UVar7, pBVar20[uVar12] == *(BYTE *)((long)ip_00 + uVar12) &&
               ((sVar11 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar12 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar7), uVar12 = sVar11,
                (BYTE *)(sVar11 + (long)ip_00) == pInLimit)))))) || (UVar7 <= uVar13)) break;
          UVar7 = pUVar3[UVar7 & uVar6 - 1];
        }
      }
      uVar18 = uVar10;
      if (uVar10 < uVar12) {
        uVar18 = uVar12;
      }
      if (3 < uVar18) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    if (uVar12 <= uVar10) {
      uVar15 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    if (uVar10 < uVar12) {
      ip = ip_00;
    }
    do {
      local_90 = ip;
      uVar10 = uVar18;
      uVar12 = uVar15;
      if (piVar9 <= ip_00) break;
      ip = (int *)((long)ip_00 + 1);
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else if ((uVar16 != 0) && (*ip == *(int *)((long)ip + lVar14))) {
        sVar11 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar14 + 5),pInLimit);
        if (sVar11 < 0xfffffffffffffffc) {
          uVar13 = (int)uVar12 + 1;
          uVar8 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
            uVar12 = 0;
            uVar10 = sVar11 + 4;
            local_90 = ip;
          }
        }
      }
      iVar17 = (int)ip;
      if (cParams->searchLength - 6 < 2) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar8 = (ms->window).lowLimit;
        uVar21 = iVar17 - (int)pBVar4;
        uVar13 = uVar21 - uVar6;
        if (uVar21 < uVar6) {
          uVar13 = 0;
        }
        iVar17 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        uVar15 = 99999999;
        uVar18 = 3;
        while( true ) {
          bVar22 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar7 <= uVar8) || (bVar22)) ||
              ((pBVar20 = pBVar4 + UVar7, pBVar20[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar11 = ZSTD_count((BYTE *)ip,pBVar20,pInLimit), uVar18 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar7), uVar18 = sVar11,
                (BYTE *)(sVar11 + (long)ip) == pInLimit)))))) || (UVar7 <= uVar13)) break;
          UVar7 = pUVar3[UVar7 & uVar6 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar8 = (ms->window).lowLimit;
        uVar21 = iVar17 - (int)pBVar4;
        uVar13 = uVar21 - uVar6;
        if (uVar21 < uVar6) {
          uVar13 = 0;
        }
        iVar17 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        uVar15 = 99999999;
        uVar18 = 3;
        while( true ) {
          bVar22 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar7 <= uVar8) || (bVar22)) ||
              ((pBVar20 = pBVar4 + UVar7, pBVar20[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar11 = ZSTD_count((BYTE *)ip,pBVar20,pInLimit), uVar18 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar7), uVar18 = sVar11,
                (BYTE *)(sVar11 + (long)ip) == pInLimit)))))) || (UVar7 <= uVar13)) break;
          UVar7 = pUVar3[UVar7 & uVar6 - 1];
        }
      }
      else {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar8 = (ms->window).lowLimit;
        uVar21 = iVar17 - (int)pBVar4;
        uVar13 = uVar21 - uVar6;
        if (uVar21 < uVar6) {
          uVar13 = 0;
        }
        iVar17 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        uVar15 = 99999999;
        uVar18 = 3;
        while( true ) {
          bVar22 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar7 <= uVar8) || (bVar22)) ||
              ((pBVar20 = pBVar4 + UVar7, pBVar20[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar11 = ZSTD_count((BYTE *)ip,pBVar20,pInLimit), uVar18 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar7), uVar18 = sVar11,
                (BYTE *)(sVar11 + (long)ip) == pInLimit)))))) || (UVar7 <= uVar13)) break;
          UVar7 = pUVar3[UVar7 & uVar6 - 1];
        }
      }
      if (uVar18 < 4) break;
      uVar13 = (int)uVar12 + 1;
      uVar8 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar13 = (int)uVar15 + 1;
      iVar17 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      ip_00 = ip;
    } while ((int)((uVar8 ^ 0x1f) + (int)uVar10 * 4 + -0x1b) < (int)uVar18 * 4 - iVar17);
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      for (; ((src < local_90 && (pBVar19 < (BYTE *)((long)local_90 + (2 - uVar12)))) &&
             (*(BYTE *)((long)local_90 + -1) == *(BYTE *)((long)local_90 + (1 - uVar12))));
          local_90 = (int *)((long)local_90 + -1)) {
        uVar10 = uVar10 + 1;
      }
      local_ac = uVar16;
      uVar16 = (int)uVar12 - 2;
    }
    ZSTD_storeSeq(seqStore,(long)local_90 - (long)src,src,(U32)uVar12,uVar10 - 3);
    uVar8 = local_ac;
    for (src = (void *)((long)local_90 + uVar10);
        ((local_ac = uVar8, uVar10 = (ulong)uVar16, ip_00 = (int *)src, local_ac != 0 &&
         (src <= piVar9)) && (*src == *(int *)((long)src - (ulong)local_ac)));
        src = (void *)((long)src + sVar11 + 4)) {
      sVar11 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_ac)),
                          pInLimit);
      ZSTD_storeSeq(seqStore,0,src,0,sVar11 + 1);
      uVar8 = uVar16;
      uVar16 = local_ac;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 1);
}